

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O3

TArray<FSpecialAction,_FSpecialAction> * __thiscall
TArray<FSpecialAction,_FSpecialAction>::operator=
          (TArray<FSpecialAction,_FSpecialAction> *this,
          TArray<FSpecialAction,_FSpecialAction> *other)

{
  if (other != this) {
    if (this->Array != (FSpecialAction *)0x0) {
      M_Free(this->Array);
    }
    DoCopy(this,other);
  }
  return this;
}

Assistant:

TArray<T,TT> &operator= (const TArray<T,TT> &other)
	{
		if (&other != this)
		{
			if (Array != NULL)
			{
				if (Count > 0)
				{
					DoDelete (0, Count-1);
				}
				M_Free (Array);
			}
			DoCopy (other);
		}
		return *this;
	}